

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Conn.cpp
# Opt level: O1

int __thiscall Conn::do_recv(Conn *this,ConnInfo *conn_info)

{
  _Base_ptr p_Var1;
  char **ppcVar2;
  uint uVar3;
  long lVar4;
  ssize_t sVar5;
  uint *puVar6;
  const_iterator __pos;
  size_t __nbytes;
  _Base_ptr p_Var7;
  uint *puVar8;
  int *piVar9;
  _Rb_tree<int,std::pair<int_const,ConnInfo>,std::_Select1st<std::pair<int_const,ConnInfo>>,std::less<int>,std::allocator<std::pair<int_const,ConnInfo>>>
  *this_00;
  uint uVar10;
  tuple<> tStack_71;
  _Head_base<0UL,_const_int_&,_false> _Stack_70;
  code *pcStack_68;
  uint uStack_60;
  ConnInfo *pCStack_50;
  ssize_t sStack_48;
  char **ppcStack_40;
  uint local_38;
  
  ppcVar2 = &(conn_info->buf)._r_pos;
  __nbytes = (long)ppcVar2 - (long)(conn_info->buf)._r_pos;
  if (__nbytes == 0) {
    ppcStack_40 = (char **)0x10317f;
    do_recv((Conn *)conn_info);
    return -3;
  }
  ppcStack_40 = (char **)0x10314e;
  sVar5 = read(conn_info->fd,(conn_info->buf)._r_pos,__nbytes);
  uVar10 = (uint)sVar5;
  if ((int)uVar10 < 0) {
    ppcStack_40 = (char **)0x10315b;
    puVar6 = (uint *)__errno_location();
    puVar8 = (uint *)(ulong)*puVar6;
    if (*puVar6 == 0xb) {
      return 0;
    }
    ppcStack_40 = (char **)0x103215;
    do_recv();
    pCStack_50 = conn_info;
    sStack_48 = sVar5;
    ppcStack_40 = ppcVar2;
    if (*(long *)(puVar8 + 0x20e) - *(long *)(puVar8 + 0x210) == 0) {
      uVar10 = 0;
    }
    else {
      pcStack_68 = (code *)0x103240;
      sVar5 = write(*puVar8,*(void **)(puVar8 + 0x210),
                    *(long *)(puVar8 + 0x20e) - *(long *)(puVar8 + 0x210));
      uVar10 = (uint)sVar5;
    }
    if ((int)uVar10 < 0) {
      pcStack_68 = (code *)0x103252;
      puVar6 = (uint *)__errno_location();
      uVar10 = *puVar6;
      if (uVar10 != 0xb) {
        pcStack_68 = Epoll::get;
        do_send();
        uVar3 = puVar8[2];
        pcStack_68 = (code *)(ulong)uVar3;
        if ((int)uVar3 < (int)uVar10) {
          this_00 = (_Rb_tree<int,std::pair<int_const,ConnInfo>,std::_Select1st<std::pair<int_const,ConnInfo>>,std::less<int>,std::allocator<std::pair<int_const,ConnInfo>>>
                     *)(ulong)uVar10;
          piVar9 = (int *)(ulong)uVar3;
          _Stack_70._M_head_impl = (int *)0x10331f;
          Epoll::get();
          p_Var7 = *(_Base_ptr *)(this_00 + 0x10);
          p_Var1 = (_Base_ptr)(this_00 + 8);
          __pos._M_node = p_Var1;
          if (p_Var7 != (_Base_ptr)0x0) {
            do {
              if (*piVar9 <= (int)p_Var7[1]._M_color) {
                __pos._M_node = p_Var7;
              }
              p_Var7 = (&p_Var7->_M_left)[(int)p_Var7[1]._M_color < *piVar9];
            } while (p_Var7 != (_Base_ptr)0x0);
          }
          if ((__pos._M_node == p_Var1) || (*piVar9 < (int)__pos._M_node[1]._M_color)) {
            _Stack_70._M_head_impl = piVar9;
            __pos._M_node =
                 (_Base_ptr)
                 std::
                 _Rb_tree<int,std::pair<int_const,ConnInfo>,std::_Select1st<std::pair<int_const,ConnInfo>>,std::less<int>,std::allocator<std::pair<int_const,ConnInfo>>>
                 ::
                 _M_emplace_hint_unique<std::piecewise_construct_t_const&,std::tuple<int_const&>,std::tuple<>>
                           (this_00,__pos,(piecewise_construct_t *)&std::piecewise_construct,
                            (tuple<const_int_&> *)&_Stack_70,&tStack_71);
          }
          return (int)__pos._M_node + 0x28;
        }
        return uVar10 * 0xc + (int)*(undefined8 *)(puVar8 + 4);
      }
    }
    else {
      pcStack_68 = (code *)0x10329b;
      uStack_60 = uVar10;
      fprintf(_stderr,"%s(%d)-<%s>: send fd: %d done, total nbytes: %d\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Wangzhike[P]epoll_echo/Conn.cpp"
              ,0xaf,"do_send",(ulong)*puVar8);
      pcStack_68 = (code *)0x1032a3;
      fflush(_stderr);
      lVar4 = *(long *)(puVar8 + 0x210);
      *(ulong *)(puVar8 + 0x210) = (ulong)uVar10 + lVar4;
      if (*(long *)(puVar8 + 0x20e) == (ulong)uVar10 + lVar4) {
        *(uint **)(puVar8 + 0x20e) = puVar8 + 0xe;
        *(uint **)(puVar8 + 0x210) = puVar8 + 0xe;
      }
      if (((char)puVar8[0x212] == '\x01') &&
         (*(long *)(puVar8 + 0x20e) == *(long *)(puVar8 + 0x210))) {
        return -4;
      }
    }
    return 0;
  }
  if (uVar10 == 0) {
    ppcStack_40 = (char **)0x1031b7;
    fprintf(_stderr,"%s(%d)-<%s>: recv fd %d, close by client\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Wangzhike[P]epoll_echo/Conn.cpp"
            ,0x8d,"do_recv",(ulong)(uint)conn_info->fd);
    ppcStack_40 = (char **)0x1031c0;
    fflush(_stderr);
    conn_info->readeof = true;
    return -1;
  }
  ppcStack_40 = (char **)0x1031f5;
  local_38 = uVar10;
  fprintf(_stderr,"%s(%d)-<%s>: read done from fd: %d, total nbytes: %d\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/Wangzhike[P]epoll_echo/Conn.cpp",
          0x93,"do_recv",(ulong)(uint)conn_info->fd);
  ppcStack_40 = (char **)0x1031fe;
  fflush(_stderr);
  *ppcVar2 = *ppcVar2 + (uVar10 & 0x7fffffff);
  return 0;
}

Assistant:

int Conn::do_recv(ConnInfo *conn_info)
{
    Buff &buf = conn_info->buf;
    // LOG_PRINT("conn_info->buf: %p, conn_info->buf.left_size(): %lu", buf._buf, buf.left_size());
    if (buf.left_size() == 0)
    {
        LOG_PRINT("sock_fd: %d can read, but buf have no space to read!", conn_info->fd);
        return err_svr_recv_nospace;
    }

    int nrecv = read(conn_info->fd, buf._r_pos, buf.left_size());
    if (nrecv < 0)
    {
        if (errno != EAGAIN)    //也就是 EWOULDBLOCK
        {
            LOG_PRINT("recv fd %d occurs error, error %s", conn_info->fd, strerror(errno));
            exit(err_svr_recv_error);
        }
    }
    else if (nrecv == 0)
    {
        LOG_PRINT("recv fd %d, close by client", conn_info->fd);
        conn_info->readeof = true;
        return err_svr_recv_eof;
    }
    else
    {
        LOG_PRINT("read done from fd: %d, total nbytes: %d", conn_info->fd, nrecv);
        buf.set_r_pow(nrecv);
        return err_svr_recv_normal;
    }

    return err_svr_recv_normal;
}